

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_tests.cpp
# Opt level: O2

void __thiscall MyEnvironment::~MyEnvironment(MyEnvironment *this)

{
  iutest::Environment::~Environment(&this->super_Environment);
  operator_delete(this,8);
  return;
}

Assistant:

class MyEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
public:
    static bool setup;
    static bool teardown;

public:
    void Reset(void)
    {
        setup = false;
        teardown = false;
    }